

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunks.c
# Opt level: O1

CURLcode cr_chunked_read(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *pnread,
                        _Bool *peos)

{
  void *pvVar1;
  curl_trc_feat *pcVar2;
  void *pvVar3;
  Curl_easy *data_00;
  _Bool _Var4;
  CURLcode CVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  size_t len;
  size_t sVar9;
  undefined8 *puVar10;
  char *pcVar11;
  bufq *pbVar12;
  bool bVar13;
  _Bool eos;
  size_t n;
  char hd [11];
  size_t nread;
  char tmp [1024];
  _Bool local_481;
  Curl_easy *local_480;
  bufq *local_478;
  size_t local_470;
  undefined1 local_468 [7];
  uint uStack_461;
  size_t local_458;
  bufq *local_450;
  char *local_448;
  size_t local_440;
  char local_438 [1032];
  
  pvVar1 = reader->ctx;
  *pnread = 0;
  *peos = (_Bool)(*(byte *)((long)pvVar1 + 0x60) >> 1 & 1);
  if ((*(byte *)((long)pvVar1 + 0x60) & 2) != 0) {
    return CURLE_OK;
  }
  local_448 = buf;
  if (((*(byte *)((long)pvVar1 + 0x60) & 1) != 0) ||
     (local_480 = data, _Var4 = Curl_bufq_is_empty((bufq *)((long)pvVar1 + 0x20)), !_Var4))
  goto LAB_0013b31b;
  local_478 = (bufq *)reader->ctx;
  sVar9 = 0x10000;
  if (blen < 0x10000) {
    sVar9 = blen;
  }
  sVar9 = sVar9 - 0xc;
  if (blen < 0x400) {
    sVar9 = 0x400;
  }
  pcVar11 = local_438;
  if (blen >= 0x400) {
    pcVar11 = local_448;
  }
  local_440 = blen;
  CVar5 = Curl_creader_read(local_480,reader->next,pcVar11,sVar9,&local_458,&local_481);
  if (CVar5 == CURLE_OK) {
    if (local_481 == true) {
      *(byte *)&local_478[1].chunk_count = (byte)local_478[1].chunk_count | 1;
    }
    if (local_458 != 0) {
      local_468 = (undefined1  [7])0x0;
      uStack_461 = 0;
      uVar6 = curl_msnprintf(local_468,0xb,"%zx\r\n");
      if ((int)uVar6 < 1) {
        CVar5 = CURLE_READ_ERROR;
        bVar13 = false;
      }
      else {
        local_450 = (bufq *)&local_478->chunk_count;
        CVar5 = Curl_bufq_cwrite(local_450,local_468,(ulong)uVar6,&local_470);
        if (CVar5 == CURLE_OK) {
          CVar5 = Curl_bufq_cwrite(local_450,pcVar11,local_458,&local_470);
        }
        if (CVar5 == CURLE_OK) {
          CVar5 = Curl_bufq_cwrite(local_450,"\r\n",2,&local_470);
        }
        if ((((local_480 != (Curl_easy *)0x0) && (((local_480->set).field_0x8cd & 0x10) != 0)) &&
            ((pcVar2 = (local_480->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
             (0 < pcVar2->log_level)))) && (0 < Curl_trc_feat_read.log_level)) {
          Curl_trc_read(local_480,"http_chunk, made chunk of %zu bytes -> %d",local_458,(ulong)CVar5
                       );
        }
        bVar13 = CVar5 == CURLE_OK;
      }
      if (!bVar13) goto LAB_0013b312;
    }
    CVar5 = CURLE_OK;
    if ((local_478[1].chunk_count & 1) != 0) {
      pvVar3 = reader->ctx;
      local_468 = (undefined1  [7])0x0;
      uStack_461 = uStack_461 & 0xffffff00;
      if ((local_480->set).trailer_callback == (curl_trailer_callback)0x0) {
        if (((local_480 != (Curl_easy *)0x0) && (((local_480->set).field_0x8cd & 0x10) != 0)) &&
           (((pcVar2 = (local_480->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
             (0 < pcVar2->log_level)) && (0 < Curl_trc_feat_read.log_level)))) {
          Curl_trc_read(local_480,"http_chunk, added last, empty chunk");
        }
        CVar5 = Curl_bufq_cwrite((bufq *)((long)pvVar3 + 0x20),"0\r\n\r\n",5,&local_470);
      }
      else {
        pbVar12 = (bufq *)((long)pvVar3 + 0x20);
        CVar5 = Curl_bufq_cwrite(pbVar12,"0\r\n",3,&local_470);
        data_00 = local_480;
        if (CVar5 == CURLE_OK) {
          Curl_set_in_callback(local_480,true);
          iVar7 = (*(data_00->set).trailer_callback)
                            ((curl_slist **)local_468,(data_00->set).trailer_data);
          Curl_set_in_callback(data_00,false);
          if (iVar7 == 0) {
            puVar10 = (undefined8 *)CONCAT17((undefined1)uStack_461,local_468);
            local_478 = pbVar12;
            if (puVar10 != (undefined8 *)0x0) {
              CVar5 = CURLE_OK;
              do {
                pcVar11 = (char *)*puVar10;
                pcVar8 = strchr(pcVar11,0x3a);
                if ((pcVar8 == (char *)0x0) || (pcVar8[1] != ' ')) {
                  iVar7 = 7;
                  if (((local_480 != (Curl_easy *)0x0) &&
                      (((local_480->set).field_0x8cd & 0x10) != 0)) &&
                     ((pcVar2 = (local_480->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar2->log_level)))) {
                    Curl_infof(local_480,"Malformatted trailing header, skipping trailer");
                  }
                }
                else {
                  len = strlen(pcVar11);
                  CVar5 = Curl_bufq_cwrite(local_478,pcVar11,len,&local_470);
                  if (CVar5 == CURLE_OK) {
                    CVar5 = Curl_bufq_cwrite(local_478,"\r\n",2,&local_470);
                  }
                  iVar7 = (uint)(CVar5 != CURLE_OK) << 2;
                }
                if ((iVar7 != 0) && (iVar7 != 7)) {
                  if (iVar7 == 4) goto LAB_0013b683;
                  goto LAB_0013b312;
                }
                puVar10 = (undefined8 *)puVar10[1];
              } while (puVar10 != (undefined8 *)0x0);
            }
            CVar5 = Curl_bufq_cwrite(local_478,"\r\n",2,&local_470);
          }
          else {
            Curl_failf(data_00,"operation aborted by trailing headers callback");
            CVar5 = CURLE_ABORTED_BY_CALLBACK;
          }
        }
LAB_0013b683:
        curl_slist_free_all((curl_slist *)CONCAT17((undefined1)uStack_461,local_468));
        if ((((local_480 != (Curl_easy *)0x0) && (((local_480->set).field_0x8cd & 0x10) != 0)) &&
            ((pcVar2 = (local_480->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
             (0 < pcVar2->log_level)))) && (0 < Curl_trc_feat_read.log_level)) {
          Curl_trc_read(local_480,"http_chunk, added last chunk with trailers from client -> %d",
                        (ulong)CVar5);
        }
      }
    }
  }
LAB_0013b312:
  blen = local_440;
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
LAB_0013b31b:
  pbVar12 = (bufq *)((long)pvVar1 + 0x20);
  _Var4 = Curl_bufq_is_empty(pbVar12);
  CVar5 = CURLE_OK;
  if ((((!_Var4) && (CVar5 = Curl_bufq_cread(pbVar12,local_448,blen,pnread), CVar5 == CURLE_OK)) &&
      ((*(byte *)((long)pvVar1 + 0x60) & 1) != 0)) && (_Var4 = Curl_bufq_is_empty(pbVar12), _Var4))
  {
    *(byte *)((long)pvVar1 + 0x60) = *(byte *)((long)pvVar1 + 0x60) | 2;
    *peos = true;
  }
  return CVar5;
}

Assistant:

static CURLcode cr_chunked_read(struct Curl_easy *data,
                                struct Curl_creader *reader,
                                char *buf, size_t blen,
                                size_t *pnread, bool *peos)
{
  struct chunked_reader *ctx = reader->ctx;
  CURLcode result = CURLE_READ_ERROR;

  *pnread = 0;
  *peos = ctx->eos;

  if(!ctx->eos) {
    if(!ctx->read_eos && Curl_bufq_is_empty(&ctx->chunkbuf)) {
      /* Still getting data form the next reader, buffer is empty */
      result = add_chunk(data, reader, buf, blen);
      if(result)
        return result;
    }

    if(!Curl_bufq_is_empty(&ctx->chunkbuf)) {
      result = Curl_bufq_cread(&ctx->chunkbuf, buf, blen, pnread);
      if(!result && ctx->read_eos && Curl_bufq_is_empty(&ctx->chunkbuf)) {
        /* no more data, read all, done. */
        ctx->eos = TRUE;
        *peos = TRUE;
      }
      return result;
    }
  }
  /* We may get here, because we are done or because callbacks paused */
  DEBUGASSERT(ctx->eos || !ctx->read_eos);
  return CURLE_OK;
}